

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
          (ConfidentialTransactionContext *this,ConfidentialTransaction *transaction)

{
  _Rb_tree_header *p_Var1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            (&this->super_ConfidentialTransaction,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  *(undefined ***)this = &PTR__ConfidentialTransactionContext_002b13e8;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->signed_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ConfidentialTransactionContext::ConfidentialTransactionContext(
    const ConfidentialTransaction& transaction)
    : ConfidentialTransaction(transaction.GetHex()) {}